

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void __thiscall NULLC::TraceArray<char>::Resize(TraceArray<char> *this,uint size)

{
  char *pcVar1;
  
  if (this->max < size) {
    if (this->count != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x3c,"void NULLC::TraceArray<char>::Resize(unsigned int) [T = char]");
    }
    if (this->data != (char *)0x0) {
      operator_delete__(this->data);
    }
    this->max = size;
    pcVar1 = (char *)operator_new__((ulong)size);
    this->data = pcVar1;
  }
  return;
}

Assistant:

void Resize(unsigned size)
		{
			if(size <= max)
				return;

			// Only for empty arrays
			assert(count == 0);

			delete[] data;
			max = size;
			data = new T[size];
		}